

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineCam.cpp
# Opt level: O2

void __thiscall chrono::geometry::ChLineCam::ArchiveIN(ChLineCam *this,ChArchiveIn *marchive)

{
  eChCamType_mapper mmapper;
  ChEnumMapper<chrono::geometry::eChCamType> CStack_198;
  ChEnumMapper<chrono::geometry::eChCamType> local_178;
  ChNameValue<chrono::ChVector<double>_> local_158;
  ChNameValue<bool> local_140;
  ChNameValue<bool> local_128;
  ChNameValue<double> local_110;
  ChNameValue<double> local_f8;
  ChNameValue<double> local_e0;
  ChNameValue<double> local_c8;
  ChNameValue<double> local_b0;
  ChNameValue<double> local_98;
  ChNameValue<double> local_80;
  ChNameValue<double> local_68;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_50;
  ChNameValue<chrono::ChEnumMapper<chrono::geometry::eChCamType>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::geometry::ChLineCam>(marchive);
  ChLine::ArchiveIN(&this->super_ChLine,marchive);
  eChCamType_mapper::eChCamType_mapper((eChCamType_mapper *)&local_178);
  eChCamType_mapper::operator()(&CStack_198,(eChCamType_mapper *)&local_178,&this->type);
  local_38._name = "type";
  local_38._flags = '\0';
  local_38._value = &CStack_198;
  ChArchiveIn::operator>>(marchive,&local_38);
  ChEnumMapper<chrono::geometry::eChCamType>::~ChEnumMapper(&CStack_198);
  local_50._value = &this->law;
  local_50._name = "law";
  local_50._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_50);
  local_68._value = &this->phase;
  local_68._name = "phase";
  local_68._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_68);
  local_80._value = &this->Rb;
  local_80._name = "Rb";
  local_80._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_80);
  local_98._value = &this->Rr;
  local_98._name = "Rr";
  local_98._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_98);
  local_b0._value = &this->p;
  local_b0._name = "p";
  local_b0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_b0);
  local_c8._value = &this->d;
  local_c8._name = "d";
  local_c8._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_c8);
  local_e0._value = &this->b0;
  local_e0._name = "b0";
  local_e0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_e0);
  local_f8._value = &this->e;
  local_f8._name = "e";
  local_f8._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_f8);
  local_110._value = &this->s;
  local_110._name = "s";
  local_110._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_110);
  local_128._value = &this->negative;
  local_128._name = "negative";
  local_128._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_128);
  local_140._value = &this->internal;
  local_140._name = "internal";
  local_140._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_140);
  local_158._value = &this->center;
  local_158._name = "center";
  local_158._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_158);
  ChEnumMapper<chrono::geometry::eChCamType>::~ChEnumMapper(&local_178);
  return;
}

Assistant:

void ChLineCam::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLineCam>();
    // deserialize parent class
    ChLine::ArchiveIN(marchive);
    // stream in all member data:
    eChCamType_mapper mmapper;
    marchive >> CHNVP(mmapper(type), "type");
    marchive >> CHNVP(law);
    marchive >> CHNVP(phase);
    marchive >> CHNVP(Rb);
    marchive >> CHNVP(Rr);
    marchive >> CHNVP(p);
    marchive >> CHNVP(d);
    marchive >> CHNVP(b0);
    marchive >> CHNVP(e);
    marchive >> CHNVP(s);
    marchive >> CHNVP(negative);
    marchive >> CHNVP(internal);
    marchive >> CHNVP(center);
}